

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LogicalExpr __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadLogicalExpr
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *this,int opcode)

{
  Kind KVar1;
  TextReader<fmt::Locale> *pTVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  AssertionFailure *this_00;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  if (0x52 < (uint)opcode) {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid opcode");
LAB_001cb556:
    __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  KVar1 = OpCodeInfo::INFO[(uint)opcode].first_kind;
  if ((int)KVar1 < 0x3b) {
    if (KVar1 == NOT) goto LAB_001cb4f9;
    if (KVar1 == FIRST_BINARY_LOGICAL) goto LAB_001cb4f1;
    if (KVar1 == FIRST_RELATIONAL) {
      pTVar2 = this->reader_;
      pcVar3 = (pTVar2->super_ReaderBase).ptr_;
      (pTVar2->super_ReaderBase).token_ = pcVar3;
      (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
      ReadNumericExpr(this,*pcVar3,false);
      pTVar2 = this->reader_;
      pcVar3 = (pTVar2->super_ReaderBase).ptr_;
      (pTVar2->super_ReaderBase).token_ = pcVar3;
      (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
      ReadNumericExpr(this,*pcVar3,false);
      return 0;
    }
switchD_001cb395_caseD_3c:
    local_38 = 0;
    uStack_30 = 0;
    local_28.types_ = 0;
    local_28.field_1.values_ = (Value *)&local_38;
    TextReader<fmt::Locale>::DoReportError
              (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x265232,&local_28
              );
  }
  else {
    switch(KVar1) {
    case ATLEAST:
      pTVar2 = this->reader_;
      pcVar3 = (pTVar2->super_ReaderBase).ptr_;
      (pTVar2->super_ReaderBase).token_ = pcVar3;
      (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
      ReadNumericExpr(this,*pcVar3,false);
      pTVar2 = this->reader_;
      pcVar3 = (pTVar2->super_ReaderBase).ptr_;
      (pTVar2->super_ReaderBase).token_ = pcVar3;
      (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
      if (*pcVar3 == 'o') {
        uVar4 = ReadOpCode(this);
        if (0x52 < uVar4) {
          this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
          AssertionFailure::AssertionFailure(this_00,"invalid opcode");
          goto LAB_001cb556;
        }
        if (OpCodeInfo::INFO[uVar4].kind != COUNT) goto LAB_001cb3e5;
      }
      else {
LAB_001cb3e5:
        local_38 = 0;
        uStack_30 = 0;
        local_28.types_ = 0;
        local_28.field_1.values_ = (Value *)&local_38;
        TextReader<fmt::Locale>::DoReportError
                  (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x2637d2,
                   &local_28);
      }
      ReadCountExpr(this);
      break;
    default:
      goto switchD_001cb395_caseD_3c;
    case IMPLICATION:
      ReadLogicalExpr(this);
LAB_001cb4f1:
      ReadLogicalExpr(this);
LAB_001cb4f9:
      ReadLogicalExpr(this);
      break;
    case EXISTS:
      iVar5 = ReadNumArgs(this,3);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      if (0 < iVar5) {
        do {
          ReadLogicalExpr(this);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      break;
    case ALLDIFF:
      iVar5 = ReadNumArgs(this,1);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      if (0 < iVar5) {
        do {
          pTVar2 = this->reader_;
          pcVar3 = (pTVar2->super_ReaderBase).ptr_;
          (pTVar2->super_ReaderBase).token_ = pcVar3;
          (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
          ReadNumericExpr(this,*pcVar3,false);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
    }
  }
  return 0;
}

Assistant:

fmt::StringRef ReadString() {
    int length = ReadUInt();
    return fmt::StringRef(length != 0 ? Read(length) : 0, length);
  }